

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O1

Aig_Man_t * Saig_ManDupOrpos(Aig_Man_t *pAig)

{
  char *__s;
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  long lVar10;
  
  if (pAig->nConstrs < 1) {
    p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
    __s = pAig->pName;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar3 = strlen(__s);
      __dest = (char *)malloc(sVar3 + 1);
      strcpy(__dest,__s);
    }
    p->pName = __dest;
    p->nConstrs = pAig->nConstrs;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    pVVar5 = pAig->vCis;
    if (0 < pVVar5->nSize) {
      lVar10 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar10];
        pAVar4 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        lVar10 = lVar10 + 1;
        pVVar5 = pAig->vCis;
      } while (lVar10 < pVVar5->nSize);
    }
    pVVar5 = pAig->vObjs;
    if (0 < pVVar5->nSize) {
      lVar10 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar10];
        if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar1 & 1) != 0) goto LAB_0064e8eb;
          uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
          }
          uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            pAVar8 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar8 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28))
            ;
          }
          pAVar4 = Aig_And(p,pAVar4,pAVar8);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        }
        lVar10 = lVar10 + 1;
        pVVar5 = pAig->vObjs;
      } while (lVar10 < pVVar5->nSize);
    }
    pAVar4 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    if (0 < pAig->nTruePos) {
      lVar10 = 0;
      do {
        if (pAig->vCos->nSize <= lVar10) goto LAB_0064e8cc;
        pvVar1 = pAig->vCos->pArray[lVar10];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_0064e8eb;
        uVar6 = *(ulong *)((long)pvVar1 + 8);
        uVar7 = uVar6 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar4 = Aig_Or(p,pAVar4,pAVar8);
        lVar10 = lVar10 + 1;
      } while (lVar10 < pAig->nTruePos);
    }
    Aig_ObjCreateCo(p,pAVar4);
    if (0 < pAig->nRegs) {
      iVar9 = 0;
      do {
        uVar2 = pAig->nTruePos + iVar9;
        if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_0064e8cc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar1 = pAig->vCos->pArray[uVar2];
        if (((ulong)pvVar1 & 1) != 0) {
LAB_0064e8eb:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar6 = *(ulong *)((long)pvVar1 + 8);
        uVar7 = uVar6 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        Aig_ObjCreateCo(p,pAVar4);
        iVar9 = iVar9 + 1;
      } while (iVar9 < pAig->nRegs);
    }
    Aig_ManCleanup(p);
    Aig_ManSetRegNum(p,pAig->nRegs);
  }
  else {
    puts("The AIG manager should have no constraints.");
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Duplicates while ORing the POs of sequential circuit.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Saig_ManDupOrpos( Aig_Man_t * pAig )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    if ( pAig->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create PO of the circuit
    pMiter = Aig_ManConst0( pAigNew );
    Saig_ManForEachPo( pAig, pObj, i )
        pMiter = Aig_Or( pAigNew, pMiter, Aig_ObjChild0Copy(pObj) );
    Aig_ObjCreateCo( pAigNew, pMiter );
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}